

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

optional<google::protobuf::internal::DescriptorNames> __thiscall
google::protobuf::anon_unknown_24::
FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
::CreateDescriptorNames
          (FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           *this,initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> bytes,
          initializer_list<unsigned_long> sizes)

{
  int iVar1;
  PointerT<char> pcVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  long lVar5;
  size_type sVar6;
  size_type extraout_RDX;
  undefined8 uVar7;
  iterator pbVar8;
  iterator pbVar9;
  size_type sVar10;
  _Storage<google::protobuf::internal::DescriptorNames,_true> unaff_R12;
  optional<google::protobuf::internal::DescriptorNames> oVar11;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  local_40 [16];
  
  sVar10 = sizes._M_len;
  sVar6 = bytes._M_len;
  pbVar9 = bytes._M_array;
  if (sVar10 != 0) {
    lVar4 = 0;
    do {
      if (0xffff < *(ulong *)((long)sizes._M_array + lVar4)) {
        uVar7 = 0;
        goto LAB_00178663;
      }
      lVar4 = lVar4 + 8;
    } while (sVar10 * 8 - lVar4 != 0);
  }
  if (sVar6 == 0) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    do {
      lVar4 = lVar4 + *(long *)((long)&pbVar9->_M_len + lVar5);
      iVar3 = (int)lVar4;
      lVar5 = lVar5 + 0x10;
    } while (sVar6 * 0x10 != lVar5);
  }
  pcVar2 = (this->pointers_).payload_.super_Base<char>.value;
  if (pcVar2 == (PointerT<char>)0x0) {
    (anonymous_namespace)::
    FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
    ::CreateDescriptorNames(local_40);
  }
  else {
    iVar1 = (this->used_).payload_.super_Base<char>.value;
    iVar3 = (iVar3 + (int)sizes._M_len * 2 + 7U & 0xfffffff8) + iVar1;
    (this->used_).payload_.super_Base<char>.value = iVar3;
    if (iVar3 <= (this->total_).payload_.super_Base<char>.value) {
      unaff_R12 = (_Storage<google::protobuf::internal::DescriptorNames,_true>)
                  ((long)pcVar2 + (long)iVar1);
      if (sVar6 != 0) {
        pbVar8 = pbVar9 + sVar6;
        do {
          __n = pbVar9->_M_len;
          memcpy((void *)unaff_R12,pbVar9->_M_str,__n);
          unaff_R12 = (_Storage<google::protobuf::internal::DescriptorNames,_true>)
                      ((long)unaff_R12 + __n);
          pbVar9 = pbVar9 + 1;
          sVar6 = extraout_RDX;
        } while (pbVar9 != pbVar8);
      }
      uVar7 = CONCAT71((int7)(sVar6 >> 8),1);
      if (sVar10 != 0) {
        lVar5 = sVar10 << 3;
        lVar4 = 0;
        do {
          *(undefined2 *)((long)unaff_R12 + lVar4) =
               *(undefined2 *)((long)sizes._M_array + lVar4 * 4);
          lVar4 = lVar4 + 2;
          lVar5 = lVar5 + -8;
        } while (lVar5 != 0);
      }
LAB_00178663:
      oVar11.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>._8_8_ =
           uVar7;
      oVar11.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>.
      _M_payload = unaff_R12;
      return (optional<google::protobuf::internal::DescriptorNames>)
             oVar11.super__Optional_base<google::protobuf::internal::DescriptorNames,_true,_true>.
             _M_payload.super__Optional_payload_base<google::protobuf::internal::DescriptorNames>;
    }
  }
  (anonymous_namespace)::
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  ::CreateDescriptorNames();
}

Assistant:

std::optional<internal::DescriptorNames> CreateDescriptorNames(
      std::initializer_list<absl::string_view> bytes,
      std::initializer_list<size_t> sizes) {
    for (size_t size : sizes) {
      // Name too long.
      if (size != static_cast<uint16_t>(size)) {
        return std::nullopt;
      }
    }

    size_t total_size = 0;
    for (auto b : bytes) total_size += b.size();
    total_size += sizes.size() * sizeof(uint16_t);
    char* out = AllocateArray<char>(total_size);
    for (absl::string_view b : bytes) {
      memcpy(out, b.data(), b.size());
      out += b.size();
    }
    auto res = internal::DescriptorNames(out);
    for (size_t size : sizes) {
      uint16_t size16 = static_cast<uint16_t>(size);
      memcpy(out, &size16, sizeof(size16));
      out += sizeof(size16);
    }
    return res;
  }